

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nsh.c
# Opt level: O0

void nsh_run(nsh_t *nsh)

{
  nsh_status_t nVar1;
  uint local_324;
  nsh_status_t cmd_status;
  uint i;
  nsh_status_t status;
  uint argc;
  char *argv [32];
  char args [32] [16];
  nsh_t *nsh_local;
  
  memset(&status,0,0x100);
  do {
    while( true ) {
      do {
        do {
          i = 0;
          nsh_io_print_prompt();
          nVar1 = nsh_read_line(nsh);
        } while (nVar1 != NSH_STATUS_OK);
        nVar1 = nsh_split_command_line((char *)nsh,' ',(char (*) [16])(argv + 0x1f),&i);
      } while (nVar1 != NSH_STATUS_OK);
      for (local_324 = 0; local_324 < i; local_324 = local_324 + 1) {
        *(char **)(&status + (ulong)local_324 * 2) = args[(ulong)local_324 - 1] + 8;
      }
      nVar1 = nsh_execute(nsh,i,(char **)&status);
      if (nVar1 != NSH_STATUS_CMD_NOT_FOUND) break;
      nsh_io_put_string("ERROR: command \'");
      nsh_io_put_string(_status);
      nsh_io_put_string("\' not found\r\n");
    }
  } while (nVar1 != NSH_STATUS_QUIT);
  return;
}

Assistant:

void nsh_run(nsh_t* nsh)
{
    // Local storage for command line after spliting
    char args[NSH_CMD_ARGS_MAX_COUNT][NSH_MAX_STRING_SIZE];

    /*
     * Array of pointers that points to the string contained by 'args'.
     *
     * In C/C++, an array decays to a pointer in most circumstances,
     * but this isn't recursive. So a T[] decays to a T*, but a T[][]
     * doesn't decay to a T**. Therefore we are forced to add an extra
     * step: char[][] -> char*[] -> char**
     */
    char* argv[NSH_CMD_ARGS_MAX_COUNT] = { NULL };

    while (true) {
        unsigned int argc = 0;

        nsh_io_print_prompt();

        // Read a command line and store it into 'nsh->line.buffer'
        nsh_status_t status = nsh_read_line(nsh);

        if (status == NSH_STATUS_OK) {
            // Split the command line into argument tokens
            if (nsh_split_command_line(nsh->line.buffer, ' ', args, &argc) != NSH_STATUS_OK) {
                // Ignore this command since there was an error
                // TODO just print a warning to the user
                continue;
            }

            // Copy the address of all tokens into 'argv'
            for (unsigned int i = 0; i < argc; i++) {
                argv[i] = args[i];
            }

            // Execute the command with 'argc' number of argument stored in 'argv'
            nsh_status_t cmd_status = nsh_execute(nsh, argc, argv);
            if (cmd_status == NSH_STATUS_CMD_NOT_FOUND) {
                nsh_io_put_string("ERROR: command '");
                nsh_io_put_string(argv[0]);
                nsh_io_put_string("' not found\r\n");
            } else if (cmd_status == NSH_STATUS_QUIT) {
                break;
            }
        }
    }
}